

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_common.c
# Opt level: O1

int nng_tls_config_alloc(nng_tls_config **cfgp,nng_tls_mode mode)

{
  return 9;
}

Assistant:

int
nng_tls_config_alloc(nng_tls_config **cfg_p, nng_tls_mode mode)
{
	nng_tls_config       *cfg;
	const nng_tls_engine *eng;
	size_t                size;
	int                   rv;

	eng = nni_atomic_get_ptr(&tls_engine);

	if (eng == NULL) {
		return (NNG_ENOTSUP);
	}

	size = NNI_ALIGN_UP(sizeof(*cfg)) + eng->config_ops->size;

	if ((cfg = nni_zalloc(size)) == NULL) {
		return (NNG_ENOMEM);
	}

	cfg->ops    = *eng->config_ops;
	cfg->size   = size;
	cfg->engine = eng;
	cfg->ref    = 1;
	cfg->busy   = false;
	nni_mtx_init(&cfg->lock);

	if ((rv = cfg->ops.init((void *) (cfg + 1), mode)) != 0) {
		nni_free(cfg, cfg->size);
		return (rv);
	}
	*cfg_p = cfg;
	return (0);
}